

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.cpp
# Opt level: O3

void skiwi::compile_length(asmcode *code,compiler_options *ops)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  skiwi *psVar2;
  uint64_t in_RDX;
  uint64_t lab;
  uint64_t lab_00;
  string error;
  string lab_finish;
  string lab_start;
  operand local_ac [3];
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  string local_40;
  
  psVar2 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&local_40,psVar2,in_RDX);
  psVar2 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&local_60,psVar2,lab);
  psVar2 = label;
  paVar1 = &local_80.field_2;
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  local_80._M_dataplus._M_p = (pointer)paVar1;
  if (ops->safe_primitives == true) {
    label = label + 1;
    label_to_string_abi_cxx11_(&local_a0,psVar2,lab_00);
    std::__cxx11::string::operator=((string *)&local_80,(string *)&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    local_a0._M_dataplus._M_p._0_4_ = 5;
    local_ac[0] = R11;
    local_ac[1] = 0x39;
    local_ac[2] = 1;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,(operation *)&local_a0,local_ac,local_ac + 1,(int *)(local_ac + 2));
    local_a0._M_dataplus._M_p._0_4_ = 0x3d;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,(operation *)&local_a0,&local_80);
  }
  local_a0._M_dataplus._M_p._0_4_ = 0x5c;
  local_ac[0] = R15;
  local_ac[1] = 0x18;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_a0,local_ac,local_ac + 1);
  local_a0._M_dataplus._M_p._0_4_ = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_a0,&local_40);
  local_a0._M_dataplus._M_p._0_4_ = 5;
  local_ac[0] = RCX;
  local_ac[1] = 0x39;
  local_ac[2] = 0x1f;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_a0,local_ac,local_ac + 1,(int *)(local_ac + 2));
  local_a0._M_dataplus._M_p._0_4_ = 0x38;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_a0,&local_60);
  if (ops->safe_primitives == true) {
    jump_if_arg_is_not_block(code,RCX,R11,&local_80);
  }
  local_ac[0] = AH;
  local_ac[1] = 0xb;
  local_ac[2] = 0x39;
  local_a0._M_dataplus._M_p = (pointer)0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,local_ac,local_ac + 1,local_ac + 2,(unsigned_long *)&local_a0);
  if (ops->safe_primitives == true) {
    jump_if_arg_does_not_point_to_pair(code,RCX,R11,&local_80);
  }
  local_a0._M_dataplus._M_p._0_4_ = 0x2b;
  local_ac[0] = R15;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_a0,local_ac);
  local_a0._M_dataplus._M_p._0_4_ = 0x40;
  local_ac[0] = RAX;
  local_ac[1] = 0x1b;
  local_ac[2] = 0x10;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_a0,local_ac,local_ac + 1,(int *)(local_ac + 2));
  local_a0._M_dataplus._M_p._0_4_ = 0x40;
  local_ac[0] = RCX;
  local_ac[1] = 9;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_a0,local_ac,local_ac + 1);
  local_a0._M_dataplus._M_p._0_4_ = 0x35;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_a0,&local_40);
  local_a0._M_dataplus._M_p._0_4_ = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_a0,&local_60);
  local_a0._M_dataplus._M_p._0_4_ = 0x40;
  local_ac[0] = RAX;
  local_ac[1] = 0x18;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_a0,local_ac,local_ac + 1);
  local_a0._M_dataplus._M_p._0_4_ = 0x55;
  local_ac[0] = RAX;
  local_ac[1] = 0x39;
  local_ac[2] = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_a0,local_ac,local_ac + 1,(int *)(local_ac + 2));
  local_a0._M_dataplus._M_p._0_4_ = 0x2c;
  local_ac[0] = RBX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_a0,local_ac);
  if (ops->safe_primitives == true) {
    error_label(code,&local_80,re_length_contract_violation);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p,
                    CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                             local_80.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void compile_length(asmcode& code, const compiler_options& ops)
  {
  auto lab_start = label_to_string(label++);
  auto lab_finish = label_to_string(label++);
  std::string error;
  if (ops.safe_primitives)
    {
    error = label_to_string(label++);
    code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 1);
    code.add(asmcode::JNES, error);
    }
  code.add(asmcode::XOR, asmcode::R15, asmcode::R15);
  code.add(asmcode::LABEL, lab_start);
  code.add(asmcode::CMP, asmcode::RCX, asmcode::NUMBER, nil);
  code.add(asmcode::JES, lab_finish);
  if (ops.safe_primitives)
    {
    jump_if_arg_is_not_block(code, asmcode::RCX, asmcode::R11, error);
    }
  code.add(asmcode::AND, asmcode::RCX, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  if (ops.safe_primitives)
    {
    jump_if_arg_does_not_point_to_pair(code, asmcode::RCX, asmcode::R11, error);
    }
  code.add(asmcode::INC, asmcode::R15);
  code.add(asmcode::MOV, asmcode::RAX, asmcode::MEM_RCX, CELLS(2));
  code.add(asmcode::MOV, asmcode::RCX, asmcode::RAX);
  code.add(asmcode::JMPS, lab_start);
  code.add(asmcode::LABEL, lab_finish);
  code.add(asmcode::MOV, asmcode::RAX, asmcode::R15);
  code.add(asmcode::SHL, asmcode::RAX, asmcode::NUMBER, 1);
  code.add(asmcode::JMP, CONTINUE);
  if (ops.safe_primitives)
    {
    error_label(code, error, re_length_contract_violation);
    }
  }